

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O1

size_t __thiscall
CVmObjStrComp::match_chars(CVmObjStrComp *this,wchar_t *valstr,size_t vallen,wchar_t refch)

{
  wchar_t wVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  long *plVar5;
  int iVar6;
  size_t sVar7;
  size_t ovallen;
  wchar_t *refstr;
  size_t reflen;
  wchar_t local_54;
  size_t local_50;
  wchar_t *local_48;
  wchar_t *local_40;
  wchar_t *local_38;
  
  wVar1 = *valstr;
  sVar7 = 1;
  if (wVar1 != refch) {
    pcVar3 = (this->super_CVmObject).ext_;
    iVar2 = *(int *)(pcVar3 + 8);
    local_54 = refch;
    local_50 = vallen;
    local_38 = valstr;
    if (iVar2 == 0) {
      local_40 = (wchar_t *)0x1;
      local_48 = &local_54;
      iVar6 = t3_compare_case_fold_min(&local_38,&local_50,&local_48,(size_t *)&local_40);
      if (iVar6 == 0) {
        return vallen - local_50;
      }
    }
    lVar4 = *(long *)(pcVar3 + (ulong)((uint)local_54 >> 8 & 0xff) * 8 + 0x10);
    if ((lVar4 == 0) ||
       (plVar5 = *(long **)(lVar4 + (ulong)(uint)(local_54 & 0xff) * 8), plVar5 == (long *)0x0)) {
      sVar7 = 0;
    }
    else {
      local_40 = (wchar_t *)plVar5[1];
      local_48 = (wchar_t *)*plVar5;
      if ((local_50 != 0) && (local_48 != (wchar_t *)0x0)) {
        do {
          local_54 = *local_40;
          if (local_54 == wVar1) {
            local_38 = local_38 + 1;
            local_50 = local_50 - 1;
            local_40 = local_40 + 1;
            local_48 = (wchar_t *)((long)local_48 + -1);
          }
          else {
            if (iVar2 != 0) {
              return 0;
            }
            iVar6 = t3_compare_case_fold_min(&local_38,&local_50,&local_40,(size_t *)&local_48);
            if (iVar6 != 0) {
              return 0;
            }
          }
        } while ((local_50 != 0) && (local_48 != (wchar_t *)0x0));
      }
      sVar7 = (long)local_38 - (long)valstr >> 2;
    }
  }
  return sVar7;
}

Assistant:

size_t CVmObjStrComp::match_chars(const wchar_t *valstr, size_t vallen,
                                  wchar_t refch)
{
    vmobj_strcmp_ext *ext = get_ext();
    int fold_case = !(ext->case_sensitive);
    vmobj_strcmp_equiv **t1;
    vmobj_strcmp_equiv *eq;
    wchar_t valch = *valstr;
    const wchar_t *start = valstr;

    /* check for an exact match first */
    if (refch == valch)
        return 1;
            
    /* check for a case-folded match if we're insensitive to case */
    if (fold_case)
    {
        /* try a minimum case-folded match to the one-character ref string */
        size_t ovallen = vallen, reflen = 1;
        const wchar_t *refstr = &refch;
        if (t3_compare_case_fold_min(valstr, vallen, refstr, reflen) == 0)
        {
            /* got it - return the length we consumed from the value string */
            return ovallen - vallen;
        }
    }

    /* check for a reference equivalence mapping */
    if ((t1 = ext->equiv[(refch >> 8) & 0xFF]) != 0
        && (eq = t1[refch & 0xFF]) != 0)
    {
        /* match each character from the mapping string */
        const wchar_t *vp;
        size_t vlen;
        for (vp = eq->val_ch, vlen = eq->val_ch_cnt ;
             vallen != 0 && vlen != 0 ; )
        {
            /* get this mapping character */
            refch = *vp;

            /* if we have an exact match, keep going */
            if (refch == valch)
            {
                /* matched exactly - skip this character and keep going */
                ++valstr, --vallen;
                ++vp, --vlen;
                continue;
            }

            /* check for a case-folded match if appropriate */
            if (fold_case
                && t3_compare_case_fold_min(valstr, vallen, vp, vlen) == 0)
            {
                /* matched - keep going */
                continue;
            }

            /* no match */
            return 0;
        }

        /* we've matched the mapping - return the match length */
        return valstr - start;
    }

    /* it doesn't match any of the possibilities */
    return 0;
}